

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cc
# Opt level: O0

PcodeOp * __thiscall FlowInfo::branchTarget(FlowInfo *this,PcodeOp *op)

{
  bool bVar1;
  Varnode *this_00;
  PcodeOp *retop;
  Address res;
  Address *addr;
  PcodeOp *op_local;
  FlowInfo *this_local;
  
  this_00 = PcodeOp::getIn(op,0);
  res.offset = (uintb)Varnode::getAddr(this_00);
  bVar1 = Address::isConstant((Address *)res.offset);
  if (bVar1) {
    Address::Address((Address *)&retop);
    this_local = (FlowInfo *)findRelTarget(this,op,(Address *)&retop);
    if (this_local == (FlowInfo *)0x0) {
      this_local = (FlowInfo *)target(this,(Address *)&retop);
    }
  }
  else {
    this_local = (FlowInfo *)target(this,(Address *)res.offset);
  }
  return (PcodeOp *)this_local;
}

Assistant:

PcodeOp *FlowInfo::branchTarget(PcodeOp *op) const

{
  const Address &addr(op->getIn(0)->getAddr());
  if (addr.isConstant()) {	// This is a relative sequence number
    Address res;
    PcodeOp *retop = findRelTarget(op,res);
    if (retop != (PcodeOp *)0)
      return retop;
    return target(res);
  }
  return target(addr);	// Otherwise a normal address target
}